

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SubstitutionTree.hpp
# Opt level: O0

bool __thiscall
Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Lhs>::
Iterator<Indexing::RetrievalAlgorithms::RobUnification<Indexing::RetrievalAlgorithms::VarBanksN<0U>_>_>
::hasLeafData(Iterator<Indexing::RetrievalAlgorithms::RobUnification<Indexing::RetrievalAlgorithms::VarBanksN<0U>_>_>
              *this)

{
  bool bVar1;
  long in_RDI;
  undefined1 local_9;
  
  bVar1 = Lib::OptionBase<Lib::VirtualIterator<Inferences::ALASCA::BinaryResolutionConf::Lhs_*>_>::
          isSome((OptionBase<Lib::VirtualIterator<Inferences::ALASCA::BinaryResolutionConf::Lhs_*>_>
                  *)(in_RDI + 0xf0));
  local_9 = false;
  if (bVar1) {
    Lib::Option<Lib::VirtualIterator<Inferences::ALASCA::BinaryResolutionConf::Lhs_*>_>::operator->
              ((Option<Lib::VirtualIterator<Inferences::ALASCA::BinaryResolutionConf::Lhs_*>_> *)
               0x43683d);
    local_9 = Lib::VirtualIterator<Inferences::ALASCA::BinaryResolutionConf::Lhs_*>::hasNext
                        ((VirtualIterator<Inferences::ALASCA::BinaryResolutionConf::Lhs_*> *)
                         0x436845);
  }
  return local_9;
}

Assistant:

bool hasNext()
      {
        if(_normalizationRecording) {
          _algo.bdDone();
          _normalizationRecording=false;
          _normalizationBacktrackData.backtrack();
        }

        while(!hasLeafData() && findNextLeaf()) {}
        return hasLeafData();
      }